

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

int is_C_identifier(char *name)

{
  ushort **ppuVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *name;
  if ((long)cVar2 == 0x22) {
    cVar2 = name[1];
    ppuVar1 = __ctype_b_loc();
    if (((((*ppuVar1)[cVar2] >> 10 & 1) != 0) || (cVar2 == '_')) || (cVar2 == '$')) {
      cVar2 = name[2];
      if (cVar2 == '\"') {
        return 1;
      }
      pcVar3 = name + 3;
      while (((((*ppuVar1)[cVar2] & 8) != 0 || (cVar2 == '$')) || (cVar2 == '_'))) {
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        if (cVar2 == '\"') {
          return 1;
        }
      }
    }
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((((*ppuVar1)[cVar2] >> 10 & 1) != 0) || (cVar2 == '_')) || (cVar2 == '$')) {
      cVar2 = name[1];
      if (cVar2 == '\0') {
        return 1;
      }
      pcVar3 = name + 2;
      while (((((*ppuVar1)[cVar2] & 8) != 0 || (cVar2 == '$')) || (cVar2 == '_'))) {
        cVar2 = *pcVar3;
        pcVar3 = pcVar3 + 1;
        if (cVar2 == '\0') {
          return 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int is_C_identifier(char *name)
{
    register char *s;
    register int c;

    s = name;
    c = *s;
    if (c == '"')
    {
	c = *++s;
	if (!isalpha(c) && c != '_' && c != '$')
	    return (0);
	while ((c = *++s) != '"')
	{
	    if (!isalnum(c) && c != '_' && c != '$')
		return (0);
	}
	return (1);
    }

    if (!isalpha(c) && c != '_' && c != '$')
	return (0);
    while ((c = *++s))
    {
	if (!isalnum(c) && c != '_' && c != '$')
	    return (0);
    }
    return (1);
}